

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SystemTimingCheckDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SystemTimingCheckDef>>>
::
nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>&&,slang::ast::SystemTimingCheckDef&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SystemTimingCheckDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SystemTimingCheckDef>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<std::basic_string_view<char,_std::char_traits<char>_>_&&,_slang::ast::SystemTimingCheckDef_&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  SystemTimingCheckDef *pSVar3;
  value_type_pointer ppVar4;
  SystemTimingCheckDef *pSVar5;
  uint uVar6;
  ushort uVar7;
  char *pcVar8;
  size_t sVar9;
  pointer pSVar10;
  undefined4 uVar11;
  ulong uVar12;
  value_type_pointer ppVar13;
  long lVar14;
  group_type_pointer pgVar15;
  undefined1 auVar16 [16];
  
  pgVar15 = __return_storage_ptr__->pg;
  uVar12 = (ulong)__return_storage_ptr__->n;
  ppVar13 = __return_storage_ptr__->p;
  lVar14 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar16[0] = -(pgVar2->m[0].n == '\0');
    auVar16[1] = -(pgVar2->m[1].n == '\0');
    auVar16[2] = -(pgVar2->m[2].n == '\0');
    auVar16[3] = -(pgVar2->m[3].n == '\0');
    auVar16[4] = -(pgVar2->m[4].n == '\0');
    auVar16[5] = -(pgVar2->m[5].n == '\0');
    auVar16[6] = -(pgVar2->m[6].n == '\0');
    auVar16[7] = -(pgVar2->m[7].n == '\0');
    auVar16[8] = -(pgVar2->m[8].n == '\0');
    auVar16[9] = -(pgVar2->m[9].n == '\0');
    auVar16[10] = -(pgVar2->m[10].n == '\0');
    auVar16[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar16[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar16[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar16[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar16[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar7 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
    if (uVar7 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar6 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar12 = (ulong)uVar6;
      ppVar4 = arrays_->elements_;
      ppVar13 = ppVar4 + pos0 * 0xf + uVar12;
      pcVar8 = args->first->_M_str;
      ppVar4[pos0 * 0xf + uVar12].first._M_len = args->first->_M_len;
      ppVar4[pos0 * 0xf + uVar12].first._M_str = pcVar8;
      pSVar5 = args->second;
      uVar11 = *(undefined4 *)&pSVar5->field_0x4;
      sVar9 = pSVar5->minArgs;
      pSVar3 = &ppVar4[pos0 * 0xf + uVar12].second;
      pSVar3->kind = pSVar5->kind;
      *(undefined4 *)&pSVar3->field_0x4 = uVar11;
      pSVar3->minArgs = sVar9;
      pSVar10 = (pSVar5->args).
                super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar4[pos0 * 0xf + uVar12].second.args.
      super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pSVar5->args).
           super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ppVar4[pos0 * 0xf + uVar12].second.args.
      super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar10;
      ppVar4[pos0 * 0xf + uVar12].second.args.
      super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pSVar5->args).
           super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pSVar5->args).
      super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar5->args).
      super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pSVar5->args).
      super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pgVar1->m[uVar12].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar15 = pgVar1;
    }
    if (uVar7 != 0) break;
    pos0 = pos0 + lVar14 & arrays_->groups_size_mask;
    lVar14 = lVar14 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar12;
  __return_storage_ptr__->p = ppVar13;
  __return_storage_ptr__->pg = pgVar15;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }